

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmOutputConverter.cxx
# Opt level: O3

string * __thiscall
cmOutputConverter::EscapeForShell_abi_cxx11_
          (string *__return_storage_ptr__,cmOutputConverter *this,string_view str,int flags)

{
  int iVar1;
  const_iterator cVar2;
  char *pcVar3;
  allocator_type *__a;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> __l;
  string_view in;
  allocator_type local_fa;
  less<std::basic_string_view<char,_std::char_traits<char>_>_> local_f9;
  key_type local_f8;
  basic_string_view<char,_std::char_traits<char>_> local_e8 [12];
  
  pcVar3 = (char *)str._M_len;
  local_f8._M_len = (size_t)this;
  local_f8._M_str = pcVar3;
  if (cmOutputConverterIsShellOperator(std::basic_string_view<char,std::char_traits<char>>)::
      shellOperators == '\0') {
    iVar1 = __cxa_guard_acquire(&cmOutputConverterIsShellOperator(std::basic_string_view<char,std::char_traits<char>>)
                                 ::shellOperators);
    if (iVar1 != 0) {
      memcpy(local_e8,&DAT_00bbca80,0xc0);
      __a = &local_fa;
      __l._M_len = 0xc;
      __l._M_array = local_e8;
      std::
      set<std::basic_string_view<char,_std::char_traits<char>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
      ::set((set<std::basic_string_view<char,_std::char_traits<char>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
             *)cmOutputConverterIsShellOperator(std::basic_string_view<char,std::char_traits<char>>)
               ::shellOperators,__l,&local_f9,__a);
      flags = (int)__a;
      __cxa_atexit(std::
                   set<std::basic_string_view<char,_std::char_traits<char>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                   ::~set,cmOutputConverterIsShellOperator(std::basic_string_view<char,std::char_traits<char>>)
                          ::shellOperators,&__dso_handle);
      __cxa_guard_release(&cmOutputConverterIsShellOperator(std::basic_string_view<char,std::char_traits<char>>)
                           ::shellOperators);
    }
  }
  cVar2 = std::
          _Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::_Identity<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
          ::find((_Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::_Identity<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                  *)cmOutputConverterIsShellOperator(std::basic_string_view<char,std::char_traits<char>>)
                    ::shellOperators,&local_f8);
  if (cVar2._M_node ==
      (_Base_ptr)
      (cmOutputConverterIsShellOperator(std::basic_string_view<char,std::char_traits<char>>)::
       shellOperators + 8)) {
    in._M_str._4_4_ = 0;
    in._0_12_ = str._0_12_;
    Shell_GetArgument_abi_cxx11_(__return_storage_ptr__,this,in,flags);
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)__return_storage_ptr__,pcVar3,pcVar3 + (long)&this->_vptr_cmOutputConverter
              );
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmOutputConverter::EscapeForShell(cm::string_view str, int flags)
{
  // Do not escape shell operators.
  if (cmOutputConverterIsShellOperator(str)) {
    return std::string(str);
  }

  return Shell_GetArgument(str, flags);
}